

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
boost::unit_test::utils::
replace_all_occurrences_of<std::__cxx11::string,std::__cxx11::string_const*>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,utils *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *last1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *last2)

{
  ulong uVar1;
  
  for (; (str != first1 && (last1 != first2)); last1 = last1 + 1) {
    while (uVar1 = std::__cxx11::string::find((string *)this,(ulong)str),
          uVar1 != 0xffffffffffffffff) {
      std::__cxx11::string::replace((ulong)this,uVar1,(string *)str->_M_string_length);
    }
    str = str + 1;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

inline StringClass
replace_all_occurrences_of( StringClass str,
                            ForwardIterator first1, ForwardIterator last1,
                            ForwardIterator first2, ForwardIterator last2)
{
    for(; first1 != last1 && first2 != last2; ++first1, ++first2) {
        std::size_t found = str.find( *first1 );
        while( found != StringClass::npos ) {
            str.replace(found, first1->size(), *first2 );
            found = str.find( *first1, found + first2->size() );
        }
    }

    return str;
}